

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
               (matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *dest,matrix_op<dlib::op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
                      *src,type alpha,bool add_to)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar4;
  undefined7 in_register_00000011;
  long c;
  long lVar5;
  long lVar6;
  long r;
  long lVar7;
  const_ret_type cVar8;
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    pmVar4 = ((src->op).m1)->lhs;
    if ((alpha != 1.0) || (NAN(alpha))) {
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < (pmVar4->op).rows; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; lVar5 < (pmVar4->op).cols; lVar5 = lVar5 + 1) {
          cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar7,lVar5);
          *(float *)((long)(dest->data).data + lVar5 * 4 + (dest->data).nc_ * lVar6) = cVar8 * alpha
          ;
          pmVar4 = ((src->op).m1)->lhs;
        }
        lVar6 = lVar6 + 4;
      }
    }
    else {
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < (pmVar4->op).rows; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; lVar5 < (pmVar4->op).cols; lVar5 = lVar5 + 1) {
          cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar7,lVar5);
          *(const_ret_type *)((long)(dest->data).data + lVar5 * 4 + (dest->data).nc_ * lVar6) =
               cVar8;
          pmVar4 = ((src->op).m1)->lhs;
        }
        lVar6 = lVar6 + 4;
      }
    }
  }
  else if ((alpha != 1.0) || (NAN(alpha))) {
    pmVar4 = ((src->op).m1)->lhs;
    if ((alpha != -1.0) || (NAN(alpha))) {
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < (pmVar4->op).rows; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; lVar5 < (pmVar4->op).cols; lVar5 = lVar5 + 1) {
          auVar9._0_4_ = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                         ::apply(&src->op,lVar7,lVar5);
          auVar9._4_60_ = extraout_var;
          lVar3 = (dest->data).nc_ * lVar6;
          pfVar1 = (dest->data).data;
          auVar2 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)alpha),
                                   ZEXT416(*(uint *)((long)pfVar1 + lVar5 * 4 + lVar3)));
          *(int *)((long)pfVar1 + lVar5 * 4 + lVar3) = auVar2._0_4_;
          pmVar4 = ((src->op).m1)->lhs;
        }
        lVar6 = lVar6 + 4;
      }
    }
    else {
      lVar6 = 0;
      for (lVar7 = 0; lVar7 < (pmVar4->op).rows; lVar7 = lVar7 + 1) {
        for (lVar5 = 0; lVar5 < (pmVar4->op).cols; lVar5 = lVar5 + 1) {
          cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                  ::apply(&src->op,lVar7,lVar5);
          lVar3 = (dest->data).nc_ * lVar6;
          pfVar1 = (dest->data).data;
          *(float *)((long)pfVar1 + lVar5 * 4 + lVar3) =
               *(float *)((long)pfVar1 + lVar5 * 4 + lVar3) - cVar8;
          pmVar4 = ((src->op).m1)->lhs;
        }
        lVar6 = lVar6 + 4;
      }
    }
  }
  else {
    lVar6 = 0;
    pmVar4 = ((src->op).m1)->lhs;
    for (lVar7 = 0; lVar7 < (pmVar4->op).rows; lVar7 = lVar7 + 1) {
      for (lVar5 = 0; lVar5 < (pmVar4->op).cols; lVar5 = lVar5 + 1) {
        cVar8 = op_scale_rows<dlib::matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
                ::apply(&src->op,lVar7,lVar5);
        lVar3 = (dest->data).nc_ * lVar6;
        pfVar1 = (dest->data).data;
        *(float *)((long)pfVar1 + lVar5 * 4 + lVar3) =
             cVar8 + *(float *)((long)pfVar1 + lVar5 * 4 + lVar3);
        pmVar4 = ((src->op).m1)->lhs;
      }
      lVar6 = lVar6 + 4;
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }